

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_heat1D_adapt.c
# Opt level: O1

sunrealtype * adapt_mesh(N_Vector y,sunindextype *Nnew,UserData udata)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  sunrealtype *psVar5;
  long lVar6;
  long lVar7;
  void *__ptr;
  size_t sVar8;
  sunrealtype *psVar9;
  long lVar10;
  long lVar11;
  
  psVar5 = udata->x;
  lVar7 = N_VGetArrayPointer();
  if (lVar7 == 0) {
    adapt_mesh_cold_2();
  }
  else {
    lVar11 = udata->N;
    __ptr = calloc(lVar11 - 1U,4);
    if (2 < lVar11) {
      dVar2 = udata->refine_tol;
      lVar10 = 0;
      do {
        dVar3 = *(double *)(lVar7 + 8 + lVar10 * 8);
        if (dVar2 < ABS((*(double *)(lVar7 + lVar10 * 8) - (dVar3 + dVar3)) +
                        *(double *)(lVar7 + 0x10 + lVar10 * 8))) {
          *(undefined8 *)((long)__ptr + lVar10 * 4) = 0x100000001;
        }
        lVar10 = lVar10 + 1;
      } while (lVar11 + -2 != lVar10);
    }
    lVar7 = 0;
    if (1 < lVar11) {
      sVar8 = 0;
      do {
        lVar7 = lVar7 + (ulong)(*(int *)((long)__ptr + sVar8 * 4) == 1);
        sVar8 = sVar8 + 1;
      } while (lVar11 - 1U != sVar8);
    }
    lVar10 = lVar11 + lVar7;
    *Nnew = lVar10;
    psVar9 = (sunrealtype *)malloc(lVar10 * 8);
    *psVar9 = *psVar5;
    lVar6 = udata->N;
    lVar7 = lVar11 + lVar7 + -1;
    psVar9[lVar10 + -1] = psVar5[lVar6 + -1];
    if (1 < lVar6) {
      lVar11 = 1;
      lVar10 = 0;
      do {
        iVar4 = *(int *)((long)__ptr + lVar10 * 4);
        if (iVar4 == 1) {
          dVar2 = psVar5[lVar10 + 1];
          psVar9[lVar11] = (psVar5[lVar10] + dVar2) * 0.5;
          psVar9[lVar11 + 1] = dVar2;
          lVar11 = lVar11 + 2;
        }
        else if (iVar4 == 0) {
          psVar9[lVar11] = psVar5[lVar10 + 1];
          lVar11 = lVar11 + 1;
        }
        lVar10 = lVar10 + 1;
      } while (lVar6 + -1 != lVar10);
    }
    lVar11 = 0;
    if (lVar7 < 1) {
      lVar7 = lVar11;
    }
    do {
      if (lVar7 == lVar11) {
        free(__ptr);
        return psVar9;
      }
      pdVar1 = psVar9 + lVar11;
      lVar10 = lVar11 + 1;
      lVar11 = lVar11 + 1;
    } while (*pdVar1 < psVar9[lVar10]);
    adapt_mesh_cold_1();
  }
  return (sunrealtype *)0x0;
}

Assistant:

sunrealtype* adapt_mesh(N_Vector y, sunindextype* Nnew, UserData udata)
{
  sunindextype i, j;
  int* marks = NULL;
  sunrealtype ydd, *xold = NULL, *Y = NULL, *xnew = NULL;
  sunindextype num_refine, N_new;

  /* Access current solution and mesh arrays */
  xold = udata->x;
  Y    = N_VGetArrayPointer(y);
  if (check_flag((void*)Y, "N_VGetArrayPointer", 0)) { return NULL; }

  /* create marking array */
  marks = calloc(udata->N - 1, sizeof(int));

  /* perform marking:
      0 -> leave alone
      1 -> refine */
  for (i = 1; i < udata->N - 1; i++)
  {
    /* approximate scaled second-derivative */
    ydd = Y[i - 1] - TWO * Y[i] + Y[i + 1];

    /* check for refinement */
    if (fabs(ydd) > udata->refine_tol)
    {
      marks[i - 1] = 1;
      marks[i]     = 1;
    }
  }

  /* allocate new mesh */
  num_refine = 0;
  for (i = 0; i < udata->N - 1; i++)
  {
    if (marks[i] == 1) { num_refine++; }
  }
  N_new = udata->N + num_refine;
  *Nnew = N_new; /* Store new array length */
  xnew  = malloc((N_new) * sizeof(sunrealtype));

  /* fill new mesh */
  xnew[0]         = xold[0]; /* store endpoints */
  xnew[N_new - 1] = xold[udata->N - 1];
  j               = 1;
  /* iterate over old intervals */
  for (i = 0; i < udata->N - 1; i++)
  {
    /* if mark is 0, reuse old interval */
    if (marks[i] == 0)
    {
      xnew[j++] = xold[i + 1];
      continue;
    }

    /* if mark is 1, refine old interval */
    if (marks[i] == 1)
    {
      xnew[j++] = PT5 * (xold[i] + xold[i + 1]);
      xnew[j++] = xold[i + 1];
      continue;
    }
  }

  /* verify that new mesh is legal */
  for (i = 0; i < N_new - 1; i++)
  {
    if (xnew[i + 1] <= xnew[i])
    {
      fprintf(stderr, "adapt_mesh error: illegal mesh created\n");
      free(xnew);
      return NULL;
    }
  }

  free(marks); /* Delete marking array */
  return xnew; /* Return with success */
}